

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

bool __thiscall
cmGeneratorTarget::CanGenerateInstallNameDir(cmGeneratorTarget *this,InstallNameType name_type)

{
  cmMakefile *pcVar1;
  bool bVar2;
  bool bVar3;
  PolicyStatus PVar4;
  allocator local_49;
  string local_48;
  
  PVar4 = GetPolicyStatusCMP0068(this);
  bVar2 = true;
  if (PVar4 != NEW) {
    pcVar1 = this->Makefile;
    std::__cxx11::string::string((string *)&local_48,"CMAKE_SKIP_RPATH",&local_49);
    bVar2 = cmMakefile::IsOn(pcVar1,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    if (name_type == INSTALL_NAME_FOR_INSTALL) {
      pcVar1 = this->Makefile;
      std::__cxx11::string::string((string *)&local_48,"CMAKE_SKIP_INSTALL_RPATH",&local_49);
      bVar3 = cmMakefile::IsOn(pcVar1,&local_48);
    }
    else {
      std::__cxx11::string::string((string *)&local_48,"SKIP_BUILD_RPATH",&local_49);
      bVar3 = GetPropertyAsBool(this,&local_48);
    }
    std::__cxx11::string::~string((string *)&local_48);
    if ((PVar4 == WARN) && ((bVar2 | bVar3) != 0)) {
      cmGlobalGenerator::AddCMP0068WarnTarget
                (this->LocalGenerator->GlobalGenerator,&this->Target->Name);
    }
    bVar2 = (bool)((bVar2 | bVar3) ^ 1);
  }
  return bVar2;
}

Assistant:

bool cmGeneratorTarget::CanGenerateInstallNameDir(
  InstallNameType name_type) const
{
  cmPolicies::PolicyStatus cmp0068 = this->GetPolicyStatusCMP0068();

  if (cmp0068 == cmPolicies::NEW) {
    return true;
  }

  bool skip = this->Makefile->IsOn("CMAKE_SKIP_RPATH");
  if (name_type == INSTALL_NAME_FOR_INSTALL) {
    skip |= this->Makefile->IsOn("CMAKE_SKIP_INSTALL_RPATH");
  } else {
    skip |= this->GetPropertyAsBool("SKIP_BUILD_RPATH");
  }

  if (skip && cmp0068 == cmPolicies::WARN) {
    this->LocalGenerator->GetGlobalGenerator()->AddCMP0068WarnTarget(
      this->GetName());
  }

  return !skip;
}